

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

int Internal_CompareAreaEstimate(ON_OutlineFigure **lhs,ON_OutlineFigure **rhs)

{
  double dVar1;
  double dVar2;
  double rhs_area;
  double lhs_area;
  ON_OutlineFigure **rhs_local;
  ON_OutlineFigure **lhs_local;
  
  dVar1 = ON_OutlineFigure::AreaEstimate(*lhs);
  dVar2 = ON_OutlineFigure::AreaEstimate(*rhs);
  if (ABS(dVar1) <= ABS(dVar2)) {
    if (ABS(dVar2) <= ABS(dVar1)) {
      lhs_local._4_4_ = 0;
    }
    else {
      lhs_local._4_4_ = 1;
    }
  }
  else {
    lhs_local._4_4_ = -1;
  }
  return lhs_local._4_4_;
}

Assistant:

static int Internal_CompareAreaEstimate(ON_OutlineFigure* const* lhs, ON_OutlineFigure* const* rhs)
{
  // Used to sort the figures_sorted_by_size[] array which is constructed in a way
  // that we know all elements are not nullptr and have valid AreaEstimates().
  const double lhs_area = fabs((*lhs)->AreaEstimate());
  const double rhs_area = fabs((*rhs)->AreaEstimate());
  if (lhs_area > rhs_area)
    return -1; // largest areas are before smaller areas
  if (lhs_area < rhs_area)
    return 1; // largest areas are before smaller areas
  return 0;
}